

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O2

v128 __thiscall wabt::interp::Istream::ReadAt<v128>(Istream *this,Offset *offset)

{
  pointer puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  v128 vVar5;
  
  uVar4 = (ulong)*offset;
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar4 + 0x10 <=
      (ulong)((long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
    uVar2 = *(undefined8 *)(puVar1 + uVar4);
    uVar3 = *(undefined8 *)(puVar1 + uVar4 + 8);
    *offset = *offset + 0x10;
    vVar5.v._8_8_ = uVar3;
    vVar5.v._0_8_ = uVar2;
    return (v128)vVar5.v;
  }
  __assert_fail("*offset + sizeof(T) <= data_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/istream.cc"
                ,0x62,"T wabt::interp::Istream::ReadAt(Offset *) const [T = v128]");
}

Assistant:

T WABT_VECTORCALL Istream::ReadAt(Offset* offset) const {
  assert(*offset + sizeof(T) <= data_.size());
  T result;
  memcpy(&result, data_.data() + *offset, sizeof(T));
  *offset += sizeof(T);
  return result;
}